

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O3

bool __thiscall Husky::ServerFrame::BindToLocalHost(ServerFrame *this,SOCKET *sock,u_short nPort)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  int nRet;
  sockaddr_in addrSock;
  string local_50;
  undefined4 local_2c;
  sockaddr local_28;
  
  iVar1 = socket(2,1,0);
  *sock = iVar1;
  if (iVar1 == -1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"error [%s]","");
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xae,&local_50,pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    bVar4 = false;
  }
  else {
    local_2c = 1;
    iVar1 = setsockopt(this->m_lsnSock,1,2,&local_2c,4);
    if (iVar1 == -1) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"error [%s]","");
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xb5,&local_50,pcVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    local_28.sa_data._0_2_ = nPort << 8 | nPort >> 8;
    local_28.sa_family = 2;
    local_28.sa_data[2] = '\0';
    local_28.sa_data[3] = '\0';
    local_28.sa_data[4] = '\0';
    local_28.sa_data[5] = '\0';
    iVar1 = bind(*sock,&local_28,0x10);
    bVar4 = iVar1 != -1;
    if (!bVar4) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"error [%s]","");
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xc0,&local_50,pcVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      close(*sock);
    }
  }
  return bVar4;
}

Assistant:

bool BindToLocalHost(SOCKET &sock,u_short nPort)   
            {
                sock=socket(AF_INET,SOCK_STREAM,0);
                if(INVALID_SOCKET==sock)
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }

                int nRet = 1;
                if(SOCKET_ERROR==setsockopt(m_lsnSock, SOL_SOCKET, SO_REUSEADDR, (char*)&nRet, sizeof(nRet)))
                {	
                    LogError("error [%s]", strerror(errno));
                }

                struct sockaddr_in addrSock;
                addrSock.sin_family=AF_INET;
                addrSock.sin_port=htons(nPort);
                addrSock.sin_addr.s_addr=htonl(INADDR_ANY);
                int retval;
                retval = ::bind(sock,(sockaddr*)&addrSock,sizeof(sockaddr));
                if(SOCKET_ERROR==retval)
                {
                    LogError("error [%s]", strerror(errno));
                    closesocket(sock);
                    return false;
                }

                return true;

            }